

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint hash_init(Hash *hash,uint windowsize)

{
  void *pvVar1;
  uint in_ESI;
  long *in_RDI;
  uint i;
  uint local_18;
  uint local_4;
  
  pvVar1 = lodepng_malloc(0x1cfdc7);
  *in_RDI = (long)pvVar1;
  pvVar1 = lodepng_malloc(0x1cfde1);
  in_RDI[2] = (long)pvVar1;
  pvVar1 = lodepng_malloc(0x1cfdfb);
  in_RDI[1] = (long)pvVar1;
  pvVar1 = lodepng_malloc(0x1cfe15);
  in_RDI[5] = (long)pvVar1;
  pvVar1 = lodepng_malloc(0x1cfe2b);
  in_RDI[3] = (long)pvVar1;
  pvVar1 = lodepng_malloc(0x1cfe45);
  in_RDI[4] = (long)pvVar1;
  if ((((*in_RDI == 0) || (in_RDI[1] == 0)) || (in_RDI[2] == 0)) ||
     (((in_RDI[3] == 0 || (in_RDI[4] == 0)) || (in_RDI[5] == 0)))) {
    local_4 = 0x53;
  }
  else {
    for (local_18 = 0; local_18 != 0x10000; local_18 = local_18 + 1) {
      *(undefined4 *)(*in_RDI + (ulong)local_18 * 4) = 0xffffffff;
    }
    for (local_18 = 0; local_18 != in_ESI; local_18 = local_18 + 1) {
      *(undefined4 *)(in_RDI[2] + (ulong)local_18 * 4) = 0xffffffff;
    }
    for (local_18 = 0; local_18 != in_ESI; local_18 = local_18 + 1) {
      *(short *)(in_RDI[1] + (ulong)local_18 * 2) = (short)local_18;
    }
    for (local_18 = 0; local_18 < 0x103; local_18 = local_18 + 1) {
      *(undefined4 *)(in_RDI[3] + (ulong)local_18 * 4) = 0xffffffff;
    }
    for (local_18 = 0; local_18 != in_ESI; local_18 = local_18 + 1) {
      *(short *)(in_RDI[4] + (ulong)local_18 * 2) = (short)local_18;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static unsigned hash_init(Hash* hash, unsigned windowsize) {
  unsigned i;
  hash->head = (int*)lodepng_malloc(sizeof(int) * HASH_NUM_VALUES);
  hash->val = (int*)lodepng_malloc(sizeof(int) * windowsize);
  hash->chain = (unsigned short*)lodepng_malloc(sizeof(unsigned short) * windowsize);

  hash->zeros = (unsigned short*)lodepng_malloc(sizeof(unsigned short) * windowsize);
  hash->headz = (int*)lodepng_malloc(sizeof(int) * (MAX_SUPPORTED_DEFLATE_LENGTH + 1));
  hash->chainz = (unsigned short*)lodepng_malloc(sizeof(unsigned short) * windowsize);

  if(!hash->head || !hash->chain || !hash->val  || !hash->headz|| !hash->chainz || !hash->zeros) {
    return 83; /*alloc fail*/
  }

  /*initialize hash table*/
  for(i = 0; i != HASH_NUM_VALUES; ++i) hash->head[i] = -1;
  for(i = 0; i != windowsize; ++i) hash->val[i] = -1;
  for(i = 0; i != windowsize; ++i) hash->chain[i] = i; /*same value as index indicates uninitialized*/

  for(i = 0; i <= MAX_SUPPORTED_DEFLATE_LENGTH; ++i) hash->headz[i] = -1;
  for(i = 0; i != windowsize; ++i) hash->chainz[i] = i; /*same value as index indicates uninitialized*/

  return 0;
}